

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absDup.c
# Opt level: O3

Gia_Man_t * Gia_ManDupAbsFlops(Gia_Man_t *p,Vec_Int_t *vFlopClasses)

{
  char *pcVar1;
  Gia_Obj_t *pGVar2;
  Gia_Obj_t *pGVar3;
  int iVar4;
  Gia_Man_t *p_00;
  size_t sVar5;
  char *pcVar6;
  Gia_Obj_t *pGVar7;
  Gia_Man_t *pGVar8;
  Vec_Int_t *pVVar9;
  int iVar10;
  int iVar11;
  ulong uVar12;
  int iVar13;
  long lVar14;
  
  Gia_ManFillValue(p);
  p_00 = Gia_ManStart(5000);
  pcVar1 = p->pName;
  if (pcVar1 == (char *)0x0) {
    pcVar6 = (char *)0x0;
  }
  else {
    sVar5 = strlen(pcVar1);
    pcVar6 = (char *)malloc(sVar5 + 1);
    strcpy(pcVar6,pcVar1);
  }
  p_00->pName = pcVar6;
  pcVar1 = p->pSpec;
  if (pcVar1 == (char *)0x0) {
    pcVar6 = (char *)0x0;
  }
  else {
    sVar5 = strlen(pcVar1);
    pcVar6 = (char *)malloc(sVar5 + 1);
    strcpy(pcVar6,pcVar1);
  }
  p_00->pSpec = pcVar6;
  p->pObjs->Value = 0;
  iVar4 = p->nRegs;
  pVVar9 = p->vCis;
  iVar13 = pVVar9->nSize;
  if (iVar4 < iVar13) {
    lVar14 = 0;
    do {
      if (iVar13 <= lVar14) goto LAB_005fac44;
      iVar13 = pVVar9->pArray[lVar14];
      if (((long)iVar13 < 0) || (p->nObjs <= iVar13)) goto LAB_005fac25;
      pGVar2 = p->pObjs;
      if (pGVar2 == (Gia_Obj_t *)0x0) break;
      pGVar7 = Gia_ManAppendObj(p_00);
      uVar12 = *(ulong *)pGVar7;
      *(ulong *)pGVar7 = uVar12 | 0x9fffffff;
      *(ulong *)pGVar7 =
           uVar12 & 0xe0000000ffffffff | 0x9fffffff |
           (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20;
      pGVar3 = p_00->pObjs;
      if ((pGVar7 < pGVar3) || (pGVar3 + p_00->nObjs <= pGVar7)) goto LAB_005fac63;
      Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar7 - (long)pGVar3) >> 2) * -0x55555555);
      pGVar3 = p_00->pObjs;
      if ((pGVar7 < pGVar3) || (pGVar3 + p_00->nObjs <= pGVar7)) goto LAB_005fac63;
      pGVar2[iVar13].Value = (int)((ulong)((long)pGVar7 - (long)pGVar3) >> 2) * 0x55555556;
      lVar14 = lVar14 + 1;
      iVar4 = p->nRegs;
      pVVar9 = p->vCis;
      iVar13 = pVVar9->nSize;
    } while (lVar14 < iVar13 - iVar4);
  }
  if (0 < iVar4) {
    lVar14 = 0;
    do {
      iVar13 = p->vCis->nSize;
      uVar12 = (ulong)(uint)(iVar13 - iVar4) + lVar14;
      iVar10 = (int)uVar12;
      if ((iVar10 < 0) || (iVar13 <= iVar10)) goto LAB_005fac44;
      iVar13 = p->vCis->pArray[uVar12 & 0xffffffff];
      if (((long)iVar13 < 0) || (p->nObjs <= iVar13)) goto LAB_005fac25;
      pGVar2 = p->pObjs;
      if (pGVar2 == (Gia_Obj_t *)0x0) break;
      if (vFlopClasses->nSize <= lVar14) goto LAB_005fac44;
      if (vFlopClasses->pArray[lVar14] == 0) {
        pGVar7 = Gia_ManAppendObj(p_00);
        uVar12 = *(ulong *)pGVar7;
        *(ulong *)pGVar7 = uVar12 | 0x9fffffff;
        *(ulong *)pGVar7 =
             uVar12 & 0xe0000000ffffffff | 0x9fffffff |
             (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20;
        pGVar3 = p_00->pObjs;
        if ((pGVar7 < pGVar3) || (pGVar3 + p_00->nObjs <= pGVar7)) goto LAB_005fac63;
        Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar7 - (long)pGVar3) >> 2) * -0x55555555);
        pGVar3 = p_00->pObjs;
        if ((pGVar7 < pGVar3) || (pGVar3 + p_00->nObjs <= pGVar7)) goto LAB_005fac63;
        pGVar2[iVar13].Value = (int)((ulong)((long)pGVar7 - (long)pGVar3) >> 2) * 0x55555556;
        iVar4 = p->nRegs;
      }
      lVar14 = lVar14 + 1;
    } while (lVar14 < iVar4);
    if (0 < iVar4) {
      lVar14 = 0;
      do {
        iVar13 = p->vCis->nSize;
        uVar12 = (ulong)(uint)(iVar13 - iVar4) + lVar14;
        iVar10 = (int)uVar12;
        if ((iVar10 < 0) || (iVar13 <= iVar10)) goto LAB_005fac44;
        iVar13 = p->vCis->pArray[uVar12 & 0xffffffff];
        if (((long)iVar13 < 0) || (p->nObjs <= iVar13)) goto LAB_005fac25;
        pGVar2 = p->pObjs;
        if (pGVar2 == (Gia_Obj_t *)0x0) break;
        if (vFlopClasses->nSize <= lVar14) goto LAB_005fac44;
        if (vFlopClasses->pArray[lVar14] != 0) {
          pGVar7 = Gia_ManAppendObj(p_00);
          uVar12 = *(ulong *)pGVar7;
          *(ulong *)pGVar7 = uVar12 | 0x9fffffff;
          *(ulong *)pGVar7 =
               uVar12 & 0xe0000000ffffffff | 0x9fffffff |
               (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20;
          pGVar3 = p_00->pObjs;
          if ((pGVar7 < pGVar3) || (pGVar3 + p_00->nObjs <= pGVar7)) {
LAB_005fac63:
            __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                          ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
          }
          Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar7 - (long)pGVar3) >> 2) * -0x55555555);
          pGVar3 = p_00->pObjs;
          if ((pGVar7 < pGVar3) || (pGVar3 + p_00->nObjs <= pGVar7)) goto LAB_005fac63;
          pGVar2[iVar13].Value = (int)((ulong)((long)pGVar7 - (long)pGVar3) >> 2) * 0x55555556;
          iVar4 = p->nRegs;
        }
        lVar14 = lVar14 + 1;
      } while (lVar14 < iVar4);
    }
  }
  Gia_ManHashAlloc(p_00);
  iVar4 = p->nRegs;
  pVVar9 = p->vCos;
  iVar13 = pVVar9->nSize;
  if (iVar4 < iVar13) {
    lVar14 = 0;
    do {
      if (iVar13 <= lVar14) goto LAB_005fac44;
      iVar13 = pVVar9->pArray[lVar14];
      if (((long)iVar13 < 0) || (p->nObjs <= iVar13)) goto LAB_005fac25;
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      pGVar2 = p->pObjs + iVar13;
      Gia_ManDupAbsFlops_rec(p_00,pGVar2 + -(*(ulong *)pGVar2 & 0x1fffffff));
      if ((int)pGVar2[-(*(ulong *)pGVar2 & 0x1fffffff)].Value < 0) goto LAB_005fac82;
      Gia_ManAppendCo(p_00,(uint)(*(ulong *)pGVar2 >> 0x1d) & 1 ^
                           pGVar2[-(*(ulong *)pGVar2 & 0x1fffffff)].Value);
      lVar14 = lVar14 + 1;
      iVar4 = p->nRegs;
      pVVar9 = p->vCos;
      iVar13 = pVVar9->nSize;
    } while (lVar14 < iVar13 - iVar4);
  }
  if (iVar4 < 1) {
    iVar13 = 0;
  }
  else {
    lVar14 = 0;
    iVar13 = 0;
    do {
      iVar10 = p->vCos->nSize;
      uVar12 = (ulong)(uint)(iVar10 - iVar4) + lVar14;
      iVar11 = (int)uVar12;
      if ((iVar11 < 0) || (iVar10 <= iVar11)) {
LAB_005fac44:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar10 = p->vCos->pArray[uVar12 & 0xffffffff];
      if (((long)iVar10 < 0) || (p->nObjs <= iVar10)) {
LAB_005fac25:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      if (vFlopClasses->nSize <= lVar14) goto LAB_005fac44;
      if (vFlopClasses->pArray[lVar14] != 0) {
        pGVar2 = p->pObjs + iVar10;
        Gia_ManDupAbsFlops_rec(p_00,pGVar2 + -(*(ulong *)pGVar2 & 0x1fffffff));
        if ((int)pGVar2[-(*(ulong *)pGVar2 & 0x1fffffff)].Value < 0) {
LAB_005fac82:
          __assert_fail("Lit >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                        ,0x132,"int Abc_LitNotCond(int, int)");
        }
        Gia_ManAppendCo(p_00,(uint)(*(ulong *)pGVar2 >> 0x1d) & 1 ^
                             pGVar2[-(*(ulong *)pGVar2 & 0x1fffffff)].Value);
        iVar13 = iVar13 + 1;
        iVar4 = p->nRegs;
      }
      lVar14 = lVar14 + 1;
    } while (lVar14 < iVar4);
  }
  Gia_ManHashStop(p_00);
  Gia_ManSetRegNum(p_00,iVar13);
  pGVar8 = Gia_ManSeqCleanup(p_00);
  Gia_ManStop(p_00);
  return pGVar8;
}

Assistant:

Gia_Man_t * Gia_ManDupAbsFlops( Gia_Man_t * p, Vec_Int_t * vFlopClasses )
{ 
    Gia_Man_t * pNew, * pTemp;
    Gia_Obj_t * pObj;
    int i, nFlops = 0;
    Gia_ManFillValue( p );
    // start the new manager
    pNew = Gia_ManStart( 5000 );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    // create PIs
    Gia_ManConst0(p)->Value = 0;
    Gia_ManForEachPi( p, pObj, i )
        pObj->Value = Gia_ManAppendCi(pNew);
    // create additional PIs
    Gia_ManForEachRo( p, pObj, i )
        if ( !Vec_IntEntry(vFlopClasses, i) )
            pObj->Value = Gia_ManAppendCi(pNew);
    // create ROs
    Gia_ManForEachRo( p, pObj, i )
        if ( Vec_IntEntry(vFlopClasses, i) )
            pObj->Value = Gia_ManAppendCi(pNew);
    // create POs
    Gia_ManHashAlloc( pNew );
    Gia_ManForEachPo( p, pObj, i )
    {
        Gia_ManDupAbsFlops_rec( pNew, Gia_ObjFanin0(pObj) );
        Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
    }
    // create RIs
    Gia_ManForEachRi( p, pObj, i )
        if ( Vec_IntEntry(vFlopClasses, i) )
        {
            Gia_ManDupAbsFlops_rec( pNew, Gia_ObjFanin0(pObj) );
            Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
            nFlops++;
        }
    Gia_ManHashStop( pNew );
    Gia_ManSetRegNum( pNew, nFlops );
    // clean up
    pNew = Gia_ManSeqCleanup( pTemp = pNew );
    Gia_ManStop( pTemp );
    return pNew;
}